

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O1

BoxArray * __thiscall amrex::AmrLevel::getNodalBoxArray(AmrLevel *this)

{
  BoxArray *this_00;
  element_type *peVar1;
  long lVar2;
  BoxArray *pBVar3;
  BoxArray *pBVar4;
  
  this_00 = &this->nodal_grids;
  peVar1 = (this->nodal_grids).m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if ((peVar1->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      *(pointer *)
       ((long)&(peVar1->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
               super__Vector_impl_data + 8)) {
    pBVar3 = &this->grids;
    pBVar4 = this_00;
    for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
      *(undefined8 *)&pBVar4->m_bat = *(undefined8 *)&pBVar3->m_bat;
      pBVar3 = (BoxArray *)&(pBVar3->m_bat).m_op.m_bndryReg.m_typ;
      pBVar4 = (BoxArray *)&(pBVar4->m_bat).m_op.m_bndryReg.m_typ;
    }
    (this->nodal_grids).m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->grids).m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->nodal_grids).m_ref.
                super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &(this->grids).m_ref.super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    (this->nodal_grids).m_simplified_list.
    super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (this->grids).m_simplified_list.
         super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->nodal_grids).m_simplified_list.
                super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &(this->grids).m_simplified_list.
                super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    BoxArray::surroundingNodes(this_00);
  }
  return this_00;
}

Assistant:

const BoxArray&
AmrLevel::getNodalBoxArray () const noexcept
{
    if (nodal_grids.empty()) {
        nodal_grids = grids;
        nodal_grids.surroundingNodes();
    }
    return nodal_grids;
}